

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.hpp
# Opt level: O3

void __thiscall
libtest::printer::cprintf<char_const*,unsigned_long>
          (printer *this,ansi_sgr *command,char *args,unsigned_long args_1)

{
  ostream *poVar1;
  allocator<char> local_91;
  string local_90;
  string local_70;
  string local_50;
  ansi_sgr local_30;
  
  poVar1 = this->os;
  ansi_sgr::to_string_abi_cxx11_(&local_50,command);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,args,&local_91);
  local_90._M_dataplus._M_p = (pointer)args_1;
  format_rec<unsigned_long>(this,&local_70,0,(unsigned_long *)&local_90);
  poVar1 = this->os;
  local_30.m_color = white;
  local_30.m_attr = reset;
  ansi_sgr::to_string_abi_cxx11_(&local_90,&local_30);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,local_90._M_dataplus._M_p,local_90._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cprintf(const ansi_sgr& command, Args... args) { os << command.to_string(), printf(args...), os << ansi_sgr{}.to_string(); }